

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O1

void mainchan_special_cmd(mainchan *mc,SessionSpecialCode code,int arg)

{
  PacketProtocolLayer *pPVar1;
  LogContext *ctx;
  bool bVar2;
  char *pcVar3;
  
  pPVar1 = mc->ppl;
  switch(code) {
  case SS_BRK:
    (*mc->sc->vt->send_serial_break)(mc->sc,false,0);
    return;
  case SS_EOF:
    if (mc->ready == false) {
      mc->eof_pending = true;
      return;
    }
    if (mc->eof_sent != false) {
      return;
    }
    (*mc->sc->vt->write_eof)(mc->sc);
    mc->eof_sent = true;
    return;
  default:
    bVar2 = true;
    pcVar3 = (char *)0x0;
    goto LAB_0013716f;
  case SS_SIGINT:
    pcVar3 = "INT";
    break;
  case SS_SIGTERM:
    pcVar3 = "TERM";
    break;
  case SS_SIGKILL:
    pcVar3 = "KILL";
    break;
  case SS_SIGQUIT:
    pcVar3 = "QUIT";
    break;
  case SS_SIGHUP:
    pcVar3 = "HUP";
    break;
  case SS_SIGABRT:
    pcVar3 = "ABRT";
    break;
  case SS_SIGALRM:
    pcVar3 = "ALRM";
    break;
  case SS_SIGFPE:
    pcVar3 = "FPE";
    break;
  case SS_SIGILL:
    pcVar3 = "ILL";
    break;
  case SS_SIGPIPE:
    pcVar3 = "PIPE";
    break;
  case SS_SIGSEGV:
    pcVar3 = "SEGV";
    break;
  case SS_SIGUSR1:
    pcVar3 = "USR1";
    break;
  case SS_SIGUSR2:
    pcVar3 = "USR2";
  }
  bVar2 = false;
LAB_0013716f:
  if (bVar2) {
    return;
  }
  (*mc->sc->vt->send_signal)(mc->sc,false,pcVar3);
  ctx = pPVar1->logctx;
  pcVar3 = dupprintf("Sent signal SIG%s",pcVar3);
  logevent_and_free(ctx,pcVar3);
  return;
}

Assistant:

void mainchan_special_cmd(mainchan *mc, SessionSpecialCode code, int arg)
{
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */
    const char *signame;

    if (code == SS_EOF) {
        if (!mc->ready) {
            /*
             * Buffer the EOF to send as soon as the main channel is
             * fully set up.
             */
            mc->eof_pending = true;
        } else if (!mc->eof_sent) {
            sshfwd_write_eof(mc->sc);
            mc->eof_sent = true;
        }
    } else if (code == SS_BRK) {
        sshfwd_send_serial_break(
            mc->sc, false, 0 /* default break length */);
    } else if ((signame = ssh_signal_lookup(code)) != NULL) {
        /* It's a signal. */
        sshfwd_send_signal(mc->sc, false, signame);
        ppl_logevent("Sent signal SIG%s", signame);
    }
}